

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-store-buy.c
# Opt level: O0

_Bool borg_good_buy(borg_item_conflict *item,int who,int ware)

{
  _Bool _Var1;
  int iVar2;
  char *what;
  borg_item_conflict *item2;
  int ii;
  int p;
  int ware_local;
  int who_local;
  borg_item_conflict *item_local;
  
  if (item->tval - 2 < 3) {
    if (borg.trait[0x23] < 0x23) {
      if (item->to_h != 0) {
        return false;
      }
      if (item->to_d != 0) {
        return false;
      }
    }
  }
  else if ((item->tval - 0x1e < 5) && (_Var1 = obj_kind_can_browse(k_info + item->kind), !_Var1)) {
    return false;
  }
  if (who == 6) {
    if (((item->tval == '\x19') && ((uint)item->sval == sv_scroll_remove_curse)) &&
       (borg.trait[0x9f] != 0)) {
      return true;
    }
    if ((((item->tval == '\x1a') &&
         ((((((uint)item->sval == sv_potion_star_healing || ((uint)item->sval == sv_potion_life)) ||
            (((uint)item->sval == sv_potion_healing ||
             (((uint)item->sval == sv_potion_inc_str && (borg.trait[10] < 0x76)))))) ||
           (((uint)item->sval == sv_potion_inc_int && (borg.trait[0xb] < 0x76)))) ||
          ((((uint)item->sval == sv_potion_inc_wis && (borg.trait[0xc] < 0x76)) ||
           ((((uint)item->sval == sv_potion_inc_dex && (borg.trait[0xd] < 0x76)) ||
            (((uint)item->sval == sv_potion_inc_con && (borg.trait[0xe] < 0x76)))))))))) ||
        ((item->tval == '\x18' &&
         ((((((uint)item->sval == sv_rod_healing ||
             ((((uint)item->sval == sv_rod_recall && (borg.trait[0x19] != 3)) &&
              (borg.trait[0x19] != 5)))) ||
            ((((uint)item->sval == sv_rod_speed && (borg.trait[0x19] != 2)) &&
             (borg.trait[0x19] != 7)))) ||
           ((((uint)item->sval == sv_rod_teleport_other && (borg.trait[0x19] != 1)) &&
            (borg.trait[0x19] == 6)))) ||
          (((uint)item->sval == sv_rod_illumination && (borg.trait[0xe4] == 0)))))))) ||
       (((_Var1 = obj_kind_can_browse(k_info + item->kind), _Var1 &&
         ((iVar2 = borg_get_book_num((uint)item->sval), borg.amt_book[iVar2] == 0 &&
          (_Var1 = borg_is_dungeon_book((uint)item->tval,(uint)item->sval), _Var1)))) ||
        ((item->tval == '\x19' &&
         (((uint)item->sval == sv_scroll_teleport_level || ((uint)item->sval == sv_scroll_teleport))
         )))))) {
      if ((borg_cfg[0x19] != 0) &&
         ((((9 < borg.trait[0x23] && (borg.trait[0x1a] != 0)) &&
           (99 < borg.trait[0x27] + (int)num_food)) &&
          ((item->cost < 0x14c09 && (0x5a < adj_dex_safe[borg.trait[0x12]] + borg.trait[0x23]))))))
      {
        borg_cfg[0x18] = item->cost;
        borg_money_scum_who = 6;
        borg_money_scum_ware = ware;
      }
      return true;
    }
    if ((borg.trait[0x23] < 0xf) && (borg.trait[0x2d] < 20000)) {
      return false;
    }
    if ((borg.trait[0x23] < 0x23) && (borg.trait[0x2d] < 15000)) {
      return false;
    }
    if (borg.trait[0x2d] < 10000) {
      return false;
    }
  }
  item2._4_4_ = 0;
  while( true ) {
    if (sold_item_num <= item2._4_4_) {
      if (item->tval == '\x06') {
        for (item2._0_4_ = 0; (int)item2 < (int)(uint)z_info->pack_size;
            item2._0_4_ = (int)item2 + 1) {
          if (borg_items[(int)item2].tval == '\x06') {
            return false;
          }
        }
      }
      if (((borg.trait[0x24] < 5) && (_Var1 = obj_kind_can_browse(k_info + item->kind), _Var1)) &&
         (item->sval != '\0')) {
        item_local._7_1_ = false;
      }
      else {
        _Var1 = borg_primarily_caster();
        if (((_Var1) || (8 < borg.trait[0x24])) ||
           ((_Var1 = obj_kind_can_browse(k_info + item->kind), !_Var1 || (item->sval == '\0')))) {
          item_local._7_1_ = true;
        }
        else {
          item_local._7_1_ = false;
        }
      }
      return item_local._7_1_;
    }
    if (((sold_item_tval[item2._4_4_] == (uint)item->tval) &&
        (sold_item_sval[item2._4_4_] == (uint)item->sval)) && (sold_item_store[item2._4_4_] == who))
    break;
    item2._4_4_ = item2._4_4_ + 1;
  }
  if (*borg_cfg != 0) {
    what = format("# Choosing not to buy back %s",item);
    borg_note(what);
  }
  return false;
}

Assistant:

static bool borg_good_buy(borg_item *item, int who, int ware)
{
    /* Check the object */
    switch (item->tval) {
    case TV_SHOT:
    case TV_ARROW:
    case TV_BOLT:
        if (borg.trait[BI_CLEVEL] < 35) {
            if (item->to_h)
                return false;
            if (item->to_d)
                return false;
        }
        break;

    case TV_PRAYER_BOOK:
    case TV_MAGIC_BOOK:
    case TV_NATURE_BOOK:
    case TV_SHADOW_BOOK:
    case TV_OTHER_BOOK: 
        /* not our book */
        if (!obj_kind_can_browse(&k_info[item->kind]))
            return false;
        break;
    }

    /* Don't buy from the BM until we are rich */
    if (who == 6) {
        /* buying Remove Curse scroll is acceptable */
        if (item->tval == TV_SCROLL && item->sval == sv_scroll_remove_curse
            && borg.trait[BI_FIRST_CURSED])
            return true;

        /* Buying certain special items are acceptable */
        if ((item->tval == TV_POTION
                && ((item->sval == sv_potion_star_healing)
                    || (item->sval == sv_potion_life)
                    || (item->sval == sv_potion_healing)
                    || (item->sval == sv_potion_inc_str
                        && borg.trait[BI_CSTR] < (18 + 100))
                    || (item->sval == sv_potion_inc_int
                        && borg.trait[BI_CINT] < (18 + 100))
                    || (item->sval == sv_potion_inc_wis
                        && borg.trait[BI_CWIS] < (18 + 100))
                    || (item->sval == sv_potion_inc_dex
                        && borg.trait[BI_CDEX] < (18 + 100))
                    || (item->sval == sv_potion_inc_con
                        && borg.trait[BI_CCON] < (18 + 100))))
            || (item->tval == TV_ROD
                && ((item->sval == sv_rod_healing) ||
                    /* priests and paladins can cast recall */
                    (item->sval == sv_rod_recall
                        && borg.trait[BI_CLASS] != CLASS_PRIEST
                        && borg.trait[BI_CLASS] != CLASS_PALADIN)
                    ||
                    /* druid and ranger can cast haste*/
                    (item->sval == sv_rod_speed
                        && borg.trait[BI_CLASS] != CLASS_DRUID
                        && borg.trait[BI_CLASS] != CLASS_RANGER)
                    ||
                    /* mage and rogue can cast teleport away */
                    (item->sval == sv_rod_teleport_other
                        && borg.trait[BI_CLASS] != CLASS_MAGE
                        && borg.trait[BI_CLASS] == CLASS_ROGUE)
                    || (item->sval == sv_rod_illumination
                        && (!borg.trait[BI_ALITE]))))
            || (obj_kind_can_browse(&k_info[item->kind])
                && borg.amt_book[borg_get_book_num(item->sval)] == 0
                && borg_is_dungeon_book(item->tval, item->sval))
            || (item->tval == TV_SCROLL
                && (item->sval == sv_scroll_teleport_level
                    || item->sval == sv_scroll_teleport))) {
            /* Hack-- Allow the borg to scum for this Item */
            if (borg_cfg[BORG_SELF_SCUM] && /* borg is allowed to scum */
                borg.trait[BI_CLEVEL] >= 10 && /* Be of sufficient level */
                borg.trait[BI_LIGHT] && /* Have some Perma lite source */
                borg.trait[BI_FOOD] + num_food >= 100
                && /* Have plenty of food */
                item->cost <= 85000) /* Its not too expensive */
            {
                if (adj_dex_safe[borg.trait[BI_DEX_INDEX]] + borg.trait[BI_CLEVEL]
                    > 90) /* Good chance to thwart mugging */
                {
                    /* Record the amount that I need to make purchase */
                    borg_cfg[BORG_MONEY_SCUM_AMOUNT] = item->cost;
                    borg_money_scum_who              = who;
                    borg_money_scum_ware             = ware;
                }
            }

            /* Ok to buy this */
            return true;
        }

        if ((borg.trait[BI_CLEVEL] < 15) && (borg.trait[BI_GOLD] < 20000))
            return false;
        if ((borg.trait[BI_CLEVEL] < 35) && (borg.trait[BI_GOLD] < 15000))
            return false;
        if (borg.trait[BI_GOLD] < 10000)
            return false;
    }

    /* do not buy the item if I just sold it. */
    for (int p = 0; p < sold_item_num; p++) {

        if (sold_item_tval[p] == item->tval && sold_item_sval[p] == item->sval
            && sold_item_store[p] == who) {
            if (borg_cfg[BORG_VERBOSE])
                borg_note(format("# Choosing not to buy back %s", item->desc));
            return false;
        }
    }

    /* Do not buy a second digger */
    if (item->tval == TV_DIGGING) {
        int ii;

        /* scan for an existing digger */
        for (ii = 0; ii < z_info->pack_size; ii++) {
            borg_item *item2 = &borg_items[ii];

            /* skip non diggers */
            if (item2->tval == TV_DIGGING)
                return false;
#if 0
            /* perhaps let him buy a digger with a better
             * pval than his current digger
             */
            { if (item->pval <= item2->pval) return false; }
#endif
        }
    }

    /* Low level borgs should not waste the money on certain things */
    if (borg.trait[BI_MAXCLEVEL] < 5) {
        /* next book, cant read it */
        if (obj_kind_can_browse(&k_info[item->kind]) && item->sval >= 1)
            return false;
    }

    /* Not direct spell casters and the extra books */
    /* classes that are direct spell casters get more than 3 books */
    if (!borg_primarily_caster() && borg.trait[BI_MAXCLEVEL] <= 8) {
        if (obj_kind_can_browse(&k_info[item->kind]) && item->sval >= 1)
            return false;
    }

    /* Okay */
    return true;
}